

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

RAMBlock *
qemu_ram_block_from_host_sparc64
          (uc_struct_conflict9 *uc,void *ptr,_Bool round_offset,ram_addr_t *offset)

{
  RAMBlock *pRVar1;
  anon_struct_16_2_6a822a49_for_next *paVar2;
  uint8_t *host;
  ulong uVar3;
  ulong uVar4;
  
  pRVar1 = (uc->ram_list).mru_block;
  if (((pRVar1 == (RAMBlock *)0x0) || (pRVar1->host == (uint8_t *)0x0)) ||
     (uVar4 = (long)ptr - (long)pRVar1->host, pRVar1->max_length <= uVar4)) {
    paVar2 = (anon_struct_16_2_6a822a49_for_next *)&(uc->ram_list).blocks;
    while( true ) {
      pRVar1 = paVar2->le_next;
      if (pRVar1 == (RAMBlock *)0x0) {
        return (RAMBlock *)0x0;
      }
      if ((pRVar1->host != (uint8_t *)0x0) &&
         (uVar4 = (long)ptr - (long)pRVar1->host, uVar4 < pRVar1->max_length)) break;
      paVar2 = &pRVar1->next;
    }
  }
  uVar3 = uVar4 & 0xffffffffffffe000;
  if (!round_offset) {
    uVar3 = uVar4;
  }
  *offset = uVar3;
  return pRVar1;
}

Assistant:

RAMBlock *qemu_ram_block_from_host(struct uc_struct *uc, void *ptr,
                                   bool round_offset, ram_addr_t *offset)
{
    RAMBlock *block;
    uint8_t *host = ptr;

    block = uc->ram_list.mru_block;
    if (block && block->host && host - block->host < block->max_length) {
        goto found;
    }

    RAMBLOCK_FOREACH(block) {
        /* This case append when the block is not mapped. */
        if (block->host == NULL) {
            continue;
        }
        if (host - block->host < block->max_length) {
            goto found;
        }
    }

    return NULL;

found:
    *offset = (host - block->host);
    if (round_offset) {
        *offset &= TARGET_PAGE_MASK;
    }
    return block;
}